

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test::TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test
          (TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test *this)

{
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupWiningStateTest::TEST_GROUP_CppUTestGroupWiningStateTest
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest);
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_001de3e0;
  return;
}

Assistant:

TEST(WiningStateTest, Not_OneShot_ReadyOnly)
{
	addNoWiningHand();

	SelfDrawnSituation situation;
	situation.is_one_shot = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::OneShot));
}